

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

out_of_range *
nlohmann::detail::out_of_range::create
          (out_of_range *__return_storage_ptr__,int id_,string *what_arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string w;
  size_type *local_80;
  size_type local_70;
  undefined8 uStack_68;
  string local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"out_of_range","");
  exception::name(&local_40,&local_60,id_);
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_40,(what_arg->_M_dataplus)._M_p,what_arg->_M_string_length);
  local_80 = (size_type *)(pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80 == paVar2) {
    local_70 = paVar2->_M_allocated_capacity;
    uStack_68 = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_80 = &local_70;
  }
  else {
    local_70 = paVar2->_M_allocated_capacity;
  }
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  exception::exception(&__return_storage_ptr__->super_exception,id_,(char *)local_80);
  *(undefined ***)&__return_storage_ptr__->super_exception = &PTR__exception_0015a108;
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static out_of_range create(int id_, const std::string& what_arg)
    {
        std::string w = exception::name("out_of_range", id_) + what_arg;
        return out_of_range(id_, w.c_str());
    }